

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O2

unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
 __thiscall
duckdb::PartitionGlobalSinkState::CreatePartition(PartitionGlobalSinkState *this,idx_t new_bits)

{
  size_type hash_col_idx;
  idx_t new_bits_local;
  
  hash_col_idx = (*(long *)(new_bits + 0xa0) - *(long *)(new_bits + 0x98)) / 0x18;
  make_uniq<duckdb::RadixPartitionedTupleData,duckdb::BufferManager&,duckdb::shared_ptr<duckdb::TupleDataLayout,true>const&,unsigned_long&,unsigned_long_const&>
            ((duckdb *)this,*(BufferManager **)(new_bits + 0x10),
             (shared_ptr<duckdb::TupleDataLayout,_true> *)(new_bits + 0x50),&new_bits_local,
             &hash_col_idx);
  return (unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
          )(unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
            )this;
}

Assistant:

unique_ptr<RadixPartitionedTupleData> PartitionGlobalSinkState::CreatePartition(idx_t new_bits) const {
	const auto hash_col_idx = payload_types.size();
	return make_uniq<RadixPartitionedTupleData>(buffer_manager, grouping_types_ptr, new_bits, hash_col_idx);
}